

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtOverlappingPairCache.cpp
# Opt level: O2

void * __thiscall
cbtHashedOverlappingPairCache::removeOverlappingPair
          (cbtHashedOverlappingPairCache *this,cbtBroadphaseProxy *proxy0,cbtBroadphaseProxy *proxy1
          ,cbtDispatcher *dispatcher)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  cbtOverlappingPairCallback *pcVar4;
  cbtBroadphasePair *pcVar5;
  cbtCollisionAlgorithm *pcVar6;
  anon_union_8_2_ea5a2114_for_cbtBroadphasePair_3 aVar7;
  uint uVar8;
  cbtBroadphasePair *pcVar9;
  int *piVar10;
  void *pvVar11;
  int iVar12;
  cbtBroadphaseProxy *pcVar13;
  int iVar14;
  ulong uVar15;
  int *piVar16;
  long lVar17;
  
  pcVar13 = proxy1;
  if (proxy1->m_uniqueId < proxy0->m_uniqueId) {
    pcVar13 = proxy0;
    proxy0 = proxy1;
  }
  uVar8 = getHash(this,proxy0->m_uniqueId,pcVar13->m_uniqueId);
  uVar15 = (long)(int)uVar8 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
  pcVar9 = internalFindPair(this,proxy0,pcVar13,(int)uVar15);
  if (pcVar9 == (cbtBroadphasePair *)0x0) {
    pvVar11 = (void *)0x0;
  }
  else {
    (*(this->super_cbtOverlappingPairCache).super_cbtOverlappingPairCallback.
      _vptr_cbtOverlappingPairCallback[8])(this,pcVar9,dispatcher);
    pvVar11 = (pcVar9->field_3).m_internalInfo1;
    piVar16 = (this->m_hashTable).m_data + uVar15;
    piVar3 = (this->m_next).m_data;
    piVar10 = piVar16;
    iVar12 = -1;
    while( true ) {
      iVar2 = *piVar10;
      iVar14 = (int)((ulong)((long)pcVar9 - (long)(this->m_overlappingPairArray).m_data) >> 5);
      if (iVar2 == iVar14) break;
      piVar10 = piVar3 + iVar2;
      iVar12 = iVar2;
    }
    piVar10 = piVar3 + iVar12;
    if (iVar12 == -1) {
      piVar10 = piVar16;
    }
    *piVar10 = piVar3[iVar14];
    lVar17 = (long)(this->m_overlappingPairArray).m_size;
    pcVar4 = this->m_ghostPairCallback;
    lVar1 = lVar17 + -1;
    if (pcVar4 != (cbtOverlappingPairCallback *)0x0) {
      (*pcVar4->_vptr_cbtOverlappingPairCallback[3])(pcVar4,proxy0,pcVar13,dispatcher);
    }
    if ((int)lVar1 != iVar14) {
      pcVar9 = (this->m_overlappingPairArray).m_data;
      uVar8 = getHash(this,(pcVar9[lVar1].m_pProxy0)->m_uniqueId,
                      (pcVar9[lVar1].m_pProxy1)->m_uniqueId);
      piVar3 = (this->m_next).m_data;
      uVar15 = (long)(int)uVar8 & (long)(this->m_overlappingPairArray).m_capacity - 1U;
      piVar16 = (this->m_hashTable).m_data + uVar15;
      piVar10 = piVar16;
      iVar12 = -1;
      while (iVar2 = *piVar10, iVar2 != (int)lVar1) {
        iVar12 = iVar2;
        piVar10 = piVar3 + iVar2;
      }
      piVar10 = piVar3 + iVar12;
      if (iVar12 == -1) {
        piVar10 = piVar16;
      }
      *piVar10 = piVar3[lVar17 + -1];
      pcVar5 = (this->m_overlappingPairArray).m_data;
      pcVar9 = pcVar5 + lVar1;
      pcVar13 = pcVar9->m_pProxy1;
      pcVar6 = pcVar9->m_algorithm;
      aVar7 = pcVar9->field_3;
      pcVar5 = pcVar5 + iVar14;
      pcVar5->m_pProxy0 = pcVar9->m_pProxy0;
      pcVar5->m_pProxy1 = pcVar13;
      pcVar5->m_algorithm = pcVar6;
      pcVar5->field_3 = aVar7;
      piVar10 = (this->m_hashTable).m_data;
      (this->m_next).m_data[iVar14] = piVar10[uVar15];
      piVar10[uVar15] = iVar14;
    }
    piVar10 = &(this->m_overlappingPairArray).m_size;
    *piVar10 = *piVar10 + -1;
  }
  return pvVar11;
}

Assistant:

void* cbtHashedOverlappingPairCache::removeOverlappingPair(cbtBroadphaseProxy* proxy0, cbtBroadphaseProxy* proxy1, cbtDispatcher* dispatcher)
{
	if (proxy0->m_uniqueId > proxy1->m_uniqueId)
		cbtSwap(proxy0, proxy1);
	int proxyId1 = proxy0->getUid();
	int proxyId2 = proxy1->getUid();

	/*if (proxyId1 > proxyId2)
		cbtSwap(proxyId1, proxyId2);*/

	int hash = static_cast<int>(getHash(static_cast<unsigned int>(proxyId1), static_cast<unsigned int>(proxyId2)) & (m_overlappingPairArray.capacity() - 1));

	cbtBroadphasePair* pair = internalFindPair(proxy0, proxy1, hash);
	if (pair == NULL)
	{
		return 0;
	}

	cleanOverlappingPair(*pair, dispatcher);

	void* userData = pair->m_internalInfo1;

	cbtAssert(pair->m_pProxy0->getUid() == proxyId1);
	cbtAssert(pair->m_pProxy1->getUid() == proxyId2);

	int pairIndex = int(pair - &m_overlappingPairArray[0]);
	cbtAssert(pairIndex < m_overlappingPairArray.size());

	// Remove the pair from the hash table.
	int index = m_hashTable[hash];
	cbtAssert(index != BT_NULL_PAIR);

	int previous = BT_NULL_PAIR;
	while (index != pairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		cbtAssert(m_next[previous] == pairIndex);
		m_next[previous] = m_next[pairIndex];
	}
	else
	{
		m_hashTable[hash] = m_next[pairIndex];
	}

	// We now move the last pair into spot of the
	// pair being removed. We need to fix the hash
	// table indices to support the move.

	int lastPairIndex = m_overlappingPairArray.size() - 1;

	if (m_ghostPairCallback)
		m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1, dispatcher);

	// If the removed pair is the last pair, we are done.
	if (lastPairIndex == pairIndex)
	{
		m_overlappingPairArray.pop_back();
		return userData;
	}

	// Remove the last pair from the hash table.
	const cbtBroadphasePair* last = &m_overlappingPairArray[lastPairIndex];
	/* missing swap here too, Nat. */
	int lastHash = static_cast<int>(getHash(static_cast<unsigned int>(last->m_pProxy0->getUid()), static_cast<unsigned int>(last->m_pProxy1->getUid())) & (m_overlappingPairArray.capacity() - 1));

	index = m_hashTable[lastHash];
	cbtAssert(index != BT_NULL_PAIR);

	previous = BT_NULL_PAIR;
	while (index != lastPairIndex)
	{
		previous = index;
		index = m_next[index];
	}

	if (previous != BT_NULL_PAIR)
	{
		cbtAssert(m_next[previous] == lastPairIndex);
		m_next[previous] = m_next[lastPairIndex];
	}
	else
	{
		m_hashTable[lastHash] = m_next[lastPairIndex];
	}

	// Copy the last pair into the remove pair's spot.
	m_overlappingPairArray[pairIndex] = m_overlappingPairArray[lastPairIndex];

	// Insert the last pair into the hash table
	m_next[pairIndex] = m_hashTable[lastHash];
	m_hashTable[lastHash] = pairIndex;

	m_overlappingPairArray.pop_back();

	return userData;
}